

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

container_t * get_copy_of_container(container_t *c,uint8_t *typecode,_Bool copy_on_write)

{
  container_t *pcVar1;
  byte in_DL;
  uint8_t *in_RSI;
  undefined8 *in_RDI;
  container_t *actual_container;
  shared_container_t *shared_container;
  container_t *in_stack_ffffffffffffffd8;
  undefined8 *local_8;
  
  if ((in_DL & 1) == 0) {
    pcVar1 = container_unwrap_shared(in_RDI,in_RSI);
    local_8 = (undefined8 *)
              container_clone(in_stack_ffffffffffffffd8,(uint8_t)((ulong)pcVar1 >> 0x38));
  }
  else if (*in_RSI == '\x04') {
    croaring_refcount_inc((croaring_refcount_t *)((long)in_RDI + 0xc));
    local_8 = in_RDI;
  }
  else {
    local_8 = (undefined8 *)roaring_malloc(0x16158f);
    if (local_8 == (undefined8 *)0x0) {
      local_8 = (undefined8 *)0x0;
    }
    else {
      *local_8 = in_RDI;
      *(uint8_t *)(local_8 + 1) = *in_RSI;
      LOCK();
      *(undefined4 *)((long)local_8 + 0xc) = 2;
      UNLOCK();
      *in_RSI = '\x04';
    }
  }
  return local_8;
}

Assistant:

container_t *get_copy_of_container(container_t *c, uint8_t *typecode,
                                   bool copy_on_write) {
    if (copy_on_write) {
        shared_container_t *shared_container;
        if (*typecode == SHARED_CONTAINER_TYPE) {
            shared_container = CAST_shared(c);
            croaring_refcount_inc(&shared_container->counter);
            return shared_container;
        }
        assert(*typecode != SHARED_CONTAINER_TYPE);

        if ((shared_container = (shared_container_t *)roaring_malloc(
                 sizeof(shared_container_t))) == NULL) {
            return NULL;
        }

        shared_container->container = c;
        shared_container->typecode = *typecode;
        // At this point, we are creating new shared container
        // so there should be no other references, and setting
        // the counter to 2 - even non-atomically - is safe as
        // long as the value is set before the return statement.
        shared_container->counter = 2;
        *typecode = SHARED_CONTAINER_TYPE;

        return shared_container;
    }  // copy_on_write
    // otherwise, no copy on write...
    const container_t *actual_container = container_unwrap_shared(c, typecode);
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return container_clone(actual_container, *typecode);
}